

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Call(w3Interp *this)

{
  pointer pwVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  pwVar1 = (this->module->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->module->functions).
                             super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pwVar1) / 0x28)) {
    pwVar1[uVar2].function_index = uVar2;
    Invoke(this,pwVar1 + uVar2);
    return;
  }
  AssertFailed("function_index < module->functions.size ()");
}

Assistant:

INTERP (Call)
{
    // FIXME In the instruction table
    const size_t function_index = instr->u32;
    Assert (function_index < module->functions.size ());
    w3Function* function = &module->functions [function_index];
    function->function_index = function_index; // TODO remove this
    Invoke (module->functions [function_index]);
}